

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

int cpu_exec_arm(uc_struct_conflict1 *uc,CPUState *cpu)

{
  CPUClass *pCVar1;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  CPUWatchpoint *pCVar4;
  CPUARMState *env;
  TranslationBlock *pTVar5;
  long lVar6;
  undefined8 uVar7;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var8;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var9;
  _Bool _Var10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  TranslationBlock *pTVar14;
  ulong uVar15;
  long lVar16;
  TranslationBlock_conflict *pTVar17;
  TranslationBlock_conflict *pTVar18;
  uint uVar19;
  uint32_t cflags;
  list_item *plVar20;
  TranslationBlock_conflict *pTVar21;
  bool bVar22;
  uint32_t flags;
  target_ulong cs_base;
  uc_tb cur_tb;
  uint32_t local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  CPUClass *local_60;
  uc_struct_conflict1 *local_58;
  ulong local_50;
  undefined2 local_48;
  undefined2 local_46;
  ulong local_40;
  uint16_t local_38;
  uint16_t local_36;
  
  pCVar1 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar1->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var10 = (*pCVar1->has_work)((CPUState_conflict *)cpu);
    if (!_Var10) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar1->cpu_exec_enter)((CPUState_conflict *)cpu);
  local_58 = uc;
  iVar12 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  local_60 = pCVar1;
  if (iVar12 != 0) {
    local_60 = cpu->cc;
  }
  do {
    uVar13 = (uint)uc;
    puVar2 = cpu->uc;
    if ((puVar2->stop_interrupt == (uc_args_int_t_conflict7)0x0) ||
       (_Var10 = (*puVar2->stop_interrupt)(puVar2,cpu->exception_index), !_Var10)) {
      uVar19 = cpu->exception_index;
      if ((int)uVar19 < 0) {
        bVar22 = false;
      }
      else if ((int)uVar19 < 0x10000) {
        bVar22 = false;
        for (plVar20 = puVar2->hook[0].head;
            (plVar20 != (list_item *)0x0 && (pvVar3 = plVar20->data, pvVar3 != (void *)0x0));
            plVar20 = plVar20->next) {
          if (*(char *)((long)pvVar3 + 0x14) == '\0') {
            (**(code **)((long)pvVar3 + 0x28))
                      (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
            bVar22 = true;
          }
        }
        if (bVar22) {
          cpu->exception_index = -1;
          uVar13 = 0x10000;
        }
        else {
          puVar2->invalid_error = 0x15;
          cpu->halted = 1;
          uVar13 = 0x10001;
        }
        bVar22 = (bool)(bVar22 ^ 1);
      }
      else {
        if (uVar19 == 0x10002) {
          pCVar1 = cpu->cc;
          if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
            for (pCVar4 = (cpu->watchpoints).tqh_first; pCVar4 != (CPUWatchpoint *)0x0;
                pCVar4 = (pCVar4->entry).tqe_next) {
              *(byte *)&pCVar4->flags = (byte)pCVar4->flags & 0x3f;
            }
          }
          (*pCVar1->debug_excp_handler)((CPUState_conflict *)cpu);
        }
        cpu->exception_index = -1;
        bVar22 = true;
        uVar13 = uVar19;
      }
    }
    else {
      plVar20 = puVar2->hook[0xe].head;
      if (plVar20 == (list_item *)0x0) {
LAB_00574ffd:
        puVar2->invalid_error = 10;
      }
      else {
        bVar11 = 0;
        while (pvVar3 = plVar20->data, pvVar3 != (void *)0x0) {
          if (((*(char *)((long)pvVar3 + 0x14) == '\0') &&
              (bVar11 = (**(code **)((long)pvVar3 + 0x28))
                                  (puVar2,*(undefined8 *)((long)pvVar3 + 0x30)), bVar11 != 0)) ||
             (plVar20 = plVar20->next, plVar20 == (list_item *)0x0)) break;
        }
        if ((bVar11 & 1) == 0) goto LAB_00574ffd;
      }
      bVar22 = true;
      uVar13 = 0x10001;
    }
    if (bVar22) {
      local_58->cpu->tcg_exit_req = 0;
      (*local_60->cpu_exec_exit)((CPUState_conflict *)cpu);
      return uVar13;
    }
    pTVar18 = (TranslationBlock_conflict *)0x0;
    pTVar17 = pTVar18;
    local_64 = uVar13;
LAB_00575106:
    pCVar1 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x1fea) = 0;
    uVar13 = cpu->interrupt_request;
    if (uVar13 == 0) {
LAB_00575121:
      if (cpu->exit_request == true) {
        cpu->exit_request = false;
        bVar22 = true;
        if (cpu->exception_index == -1) {
          cpu->exception_index = 0x10000;
        }
      }
      else {
        bVar22 = false;
      }
    }
    else {
      uVar19 = uVar13;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar19 = uVar13 & 0xffffeda5;
      }
      if ((char)uVar19 < '\0') {
        cpu->interrupt_request = uVar13 & 0xffffff7f;
        cpu->exception_index = 0x10002;
      }
      else {
        if ((uVar19 >> 10 & 1) == 0) {
          _Var10 = (*pCVar1->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar19);
          if (_Var10) {
            cpu->exception_index = -1;
            pTVar17 = (TranslationBlock_conflict *)0x0;
          }
          if ((cpu->interrupt_request & 4) != 0) {
            cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
            pTVar17 = (TranslationBlock_conflict *)0x0;
          }
          goto LAB_00575121;
        }
        cpu_reset(cpu);
      }
      bVar22 = true;
    }
    if (!bVar22) {
      cflags = cpu->cflags_next_tb;
      if (cflags == 0xffffffff) {
        cflags = 0;
      }
      else {
        cpu->cflags_next_tb = 0xffffffff;
      }
      puVar2 = cpu->uc;
      env = (CPUARMState *)cpu->env_ptr;
      cpu_get_tb_cpu_state_arm(env,(target_ulong *)&local_6c,(target_ulong *)&local_68,&local_70);
      bVar11 = (char)env->uc->init_target_page->bits - 6;
      uVar13 = local_6c >> (bVar11 & 0x1f) ^ local_6c;
      uVar13 = uVar13 & 0x3f | uVar13 >> (bVar11 & 0x1f) & 0xfc0;
      pTVar14 = cpu->tb_jmp_cache[uVar13];
      uVar19 = cpu->cluster_index << 0x18 | cflags & 0xffffff;
      if ((((pTVar14 == (TranslationBlock *)0x0) || ((target_ulong_conflict)pTVar14->pc != local_6c)
           ) || ((*(target_ulong_conflict *)((long)&pTVar14->pc + 4) != local_68 ||
                 (((uint32_t)pTVar14->cs_base != local_70 ||
                  (cpu->trace_dstate[0] != (ulong)*(uint *)&pTVar14->size)))))) ||
         ((pTVar14->flags & 0xff0effff) != uVar19)) {
        pTVar14 = tb_htable_lookup_arm(cpu,(ulong)local_6c,(ulong)local_68,local_70,uVar19);
        if (pTVar14 == (TranslationBlock *)0x0) {
          pTVar14 = (TranslationBlock *)0x0;
        }
        else {
          cpu->tb_jmp_cache[uVar13] = pTVar14;
        }
      }
      if (pTVar14 == (TranslationBlock *)0x0) {
        pTVar14 = (TranslationBlock *)tb_gen_code_arm(cpu,local_6c,local_68,local_70,cflags);
        bVar11 = (char)cpu->uc->init_target_page->bits - 6;
        uVar13 = local_6c >> (bVar11 & 0x1f) ^ local_6c;
        cpu->tb_jmp_cache[uVar13 & 0x3f | uVar13 >> (bVar11 & 0x1f) & 0xfc0] = pTVar14;
        pTVar5 = puVar2->last_tb;
        if (pTVar5 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar14->pc;
          local_38 = *(uint16_t *)((long)&pTVar14->cs_base + 6);
          local_36 = *(uint16_t *)((long)&pTVar14->cs_base + 4);
          local_50 = (ulong)(uint)pTVar5->pc;
          local_48 = *(undefined2 *)((long)&pTVar5->cs_base + 6);
          local_46 = *(undefined2 *)((long)&pTVar5->cs_base + 4);
          for (plVar20 = puVar2->hook[0xf].head;
              (plVar20 != (list_item *)0x0 && (pvVar3 = plVar20->data, pvVar3 != (void *)0x0));
              plVar20 = plVar20->next) {
            if (*(char *)((long)pvVar3 + 0x14) == '\0') {
              uVar15 = (ulong)(uint)pTVar14->pc;
              if (((*(ulong *)((long)pvVar3 + 0x18) <= uVar15) &&
                  (uVar15 <= *(ulong *)((long)pvVar3 + 0x20))) ||
                 (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))) {
                (**(code **)((long)pvVar3 + 0x28))
                          (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
              }
            }
          }
        }
      }
      if ((pTVar17 != (TranslationBlock_conflict *)0x0) &&
         (pTVar14->page_addr[0] == 0xffffffffffffffff)) {
        if (1 < (uint)pTVar18) {
          __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                        ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
        }
        if ((pTVar14->flags & 0x40000) == 0) {
          LOCK();
          bVar22 = pTVar17->jmp_dest[(long)pTVar18] == 0;
          if (bVar22) {
            pTVar17->jmp_dest[(long)pTVar18] = (uintptr_t)pTVar14;
          }
          UNLOCK();
          if (bVar22) {
            pvVar3 = (pTVar17->tc).ptr;
            *(int *)(pTVar17->jmp_target_arg[(long)pTVar18] + (long)pvVar3) =
                 (*(int *)&((tb_tc *)&pTVar14->cflags)->ptr -
                 ((int)pTVar17->jmp_target_arg[(long)pTVar18] + (int)pvVar3)) + -4;
            pTVar17->jmp_list_next[(long)pTVar18] = pTVar14->jmp_target_arg[1];
            pTVar14->jmp_target_arg[1] = (ulong)pTVar17 | (ulong)pTVar18;
          }
        }
      }
      if (cpu->exit_request == false) {
        pvVar3 = cpu->env_ptr;
        tb_exec_lock_arm((TCGContext_conflict *)cpu->uc->tcg_ctx);
        uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x1128) + 0x2e8) + 0x90))(pvVar3);
        if (cpu->uc->nested_level == 1) {
          tb_exec_unlock_arm((TCGContext_conflict *)cpu->uc->tcg_ctx);
        }
        cpu->can_do_io = 1;
        pTVar21 = (TranslationBlock_conflict *)(uVar15 & 0xfffffffffffffffc);
        if ((uVar15 & 2) != 0) {
          if (*(long *)(*(long *)((long)pvVar3 + 0x1128) + 0x358) == 0) {
            uVar13 = *(uint *)(*(long *)((long)pvVar3 + 0x1128) + 0x578);
            if (((0x12 < uVar13) || ((0x771c0U >> (uVar13 & 0x1f) & 1) == 0)) &&
               (cpu->uc->quit_request == false)) {
              p_Var8 = cpu->cc->synchronize_from_tb;
              if (p_Var8 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                p_Var9 = cpu->cc->set_pc;
                if (p_Var9 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_00575753;
                (*p_Var9)((CPUState_conflict *)cpu,(ulong)pTVar21->pc);
              }
              else {
                (*p_Var8)((CPUState_conflict *)cpu,pTVar21);
              }
            }
          }
          cpu->tcg_exit_req = 0;
        }
        cpu->uc->last_tb = pTVar14;
        uVar13 = (uint)uVar15 & 3;
        pTVar18 = (TranslationBlock_conflict *)(ulong)uVar13;
        pTVar17 = pTVar21;
        if (uVar13 == 3) {
          pTVar17 = (TranslationBlock_conflict *)0x0;
          pTVar18 = (TranslationBlock_conflict *)0x3;
          if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x3fd)) {
            lVar6 = cpu->icount_budget;
            lVar16 = 0xffff;
            if (lVar6 < 0xffff) {
              lVar16 = lVar6;
            }
            uVar13 = (uint)lVar16;
            *(short *)(cpu[1].tb_jmp_cache + 0x3fd) = (short)lVar16;
            cpu->icount_extra = lVar6 - (int)uVar13;
            pTVar17 = (TranslationBlock_conflict *)0x0;
            pTVar18 = (TranslationBlock_conflict *)0x3;
            if (0 < (int)uVar13 && lVar6 - (int)uVar13 == 0) {
              uVar19 = 0x7fff;
              if ((int)uVar13 < 0x7fff) {
                uVar19 = uVar13;
              }
              pTVar14 = (TranslationBlock *)
                        tb_gen_code_arm(cpu,pTVar21->pc,pTVar21->cs_base,pTVar21->flags,
                                        uVar19 | 0x10000);
              (pTVar14->tc).size = (size_t)pTVar21;
              pvVar3 = cpu->env_ptr;
              uVar7._0_4_ = pTVar14->cflags;
              uVar7._4_4_ = pTVar14->trace_vcpu_dstate;
              tb_exec_lock_arm((TCGContext_conflict *)cpu->uc->tcg_ctx);
              uVar15 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x1128) + 0x2e8) + 0x90))
                                 (pvVar3,uVar7);
              if (cpu->uc->nested_level == 1) {
                tb_exec_unlock_arm((TCGContext_conflict *)cpu->uc->tcg_ctx);
              }
              cpu->can_do_io = 1;
              if ((uVar15 & 2) != 0) {
                if (*(long *)(*(long *)((long)pvVar3 + 0x1128) + 0x358) == 0) {
                  uVar13 = *(uint *)(*(long *)((long)pvVar3 + 0x1128) + 0x578);
                  if (((0x12 < uVar13) || ((0x771c0U >> (uVar13 & 0x1f) & 1) == 0)) &&
                     (cpu->uc->quit_request == false)) {
                    p_Var8 = cpu->cc->synchronize_from_tb;
                    if (p_Var8 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                      p_Var9 = cpu->cc->set_pc;
                      if (p_Var9 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_00575753:
                        __assert_fail("cc->set_pc",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                      ,0x61,
                                      "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)"
                                     );
                      }
                      (*p_Var9)((CPUState_conflict *)cpu,
                                (ulong)((TranslationBlock_conflict *)(uVar15 & 0xfffffffffffffffc))
                                       ->pc);
                    }
                    else {
                      (*p_Var8)((CPUState_conflict *)cpu,
                                (TranslationBlock_conflict *)(uVar15 & 0xfffffffffffffffc));
                    }
                  }
                }
                cpu->tcg_exit_req = 0;
              }
              tb_phys_invalidate_arm
                        ((TCGContext_conflict *)cpu->uc->tcg_ctx,
                         (TranslationBlock_conflict *)pTVar14,0xffffffffffffffff);
              tcg_tb_remove_arm((TCGContext_conflict *)cpu->uc->tcg_ctx,pTVar14);
              pTVar17 = (TranslationBlock_conflict *)0x0;
              pTVar18 = (TranslationBlock_conflict *)0x3;
            }
          }
        }
      }
      goto LAB_00575106;
    }
    uc = (uc_struct_conflict1 *)(ulong)local_64;
  } while( true );
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}